

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

int variance_final_1024_avx2(__m256i vsse,__m256i vsum,uint *sse)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint *in_RDX;
  longlong in_RSI;
  undefined1 in_ZMM1 [64];
  __m128i vsum_00;
  
  auVar1 = vpaddw_avx(in_ZMM1._16_16_,in_ZMM1._0_16_);
  auVar2 = vpmovsxwd_avx(auVar1);
  auVar1 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpmovsxwd_avx(auVar1);
  vpaddd_avx(auVar1,auVar2);
  vsum_00[1] = in_RSI;
  vsum_00[0] = (longlong)sse;
  iVar3 = variance_final_from_32bit_sum_avx2(vsse,vsum_00,in_RDX);
  return iVar3;
}

Assistant:

static inline int variance_final_1024_avx2(__m256i vsse, __m256i vsum,
                                           unsigned int *const sse) {
  // extract the low lane and add it to the high lane
  const __m128i vsum_128 = mm256_add_hi_lo_epi16(vsum);
  const __m128i vsum_64 =
      _mm_add_epi32(_mm_cvtepi16_epi32(vsum_128),
                    _mm_cvtepi16_epi32(_mm_srli_si128(vsum_128, 8)));
  return variance_final_from_32bit_sum_avx2(vsse, vsum_64, sse);
}